

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)

{
  char *pcVar1;
  uint8_t *puVar2;
  SmbiosHandle_t *base;
  
  board_info_area.area.format_version = '\x01';
  board_info_area.area.language_code = '\x19';
  board_info_area.area.mfg_date_time[0] = '\0';
  board_info_area.area.mfg_date_time[1] = '\0';
  board_info_area.area.mfg_date_time[2] = '\0';
  base = info->Handles + info->ContainedHndls;
  pcVar1 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar1 == (char *)0x0) {
    board_info_area.area.variable_part[0] = 0xc0;
    puVar2 = board_info_area.pad;
  }
  else {
    puVar2 = IpmiFruAddString(board_info_area.area.variable_part,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->Product,base);
  if (pcVar1 == (char *)0x0) {
    *puVar2 = 0xc0;
    puVar2 = puVar2 + 1;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar1 == (char *)0x0) {
    *puVar2 = 0xc0;
    puVar2 = puVar2 + 1;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2,pcVar1);
  }
  puVar2[0] = 0xc0;
  puVar2[1] = 0xc0;
  puVar2 = puVar2 + 2;
  pcVar1 = GetSmbiosString(info->Version,base);
  if (pcVar1 != (char *)0x0) {
    puVar2 = IpmiFruAddCustomString(puVar2,"VERSION",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->Location,base);
  if (pcVar1 != (char *)0x0) {
    puVar2 = IpmiFruAddCustomString(puVar2,"LOCATION",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->AssetTag,base);
  if (pcVar1 != (char *)0x0) {
    puVar2 = IpmiFruAddCustomString(puVar2,"ASSET_TAG",pcVar1);
  }
  board_info_area_size = IpmiFruFinalizeArea((uint8_t *)&board_info_area,(int)puVar2 - 0x105964);
  return;
}

Assistant:

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)
{
    board_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    board_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    board_info_area.area.mfg_date_time[0] = 0;
    board_info_area.area.mfg_date_time[1] = 0;
    board_info_area.area.mfg_date_time[2] = 0;
    uint8_t *varp = board_info_area.area.variable_part;

    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->Product, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Part number - not specified
    *varp++ = 0xC0;
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Version as custom string
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddCustomString(varp, "VERSION", str);
    }
    //  Location as custom string
    if (str = GetSmbiosString(info->Location, strstart)) {
        varp = IpmiFruAddCustomString(varp, "LOCATION", str);
    }
    //  Asset tag as custom string
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        varp = IpmiFruAddCustomString(varp, "ASSET_TAG", str);
    }
    uint8_t *board_area_ptr = (uint8_t *)&board_info_area;
    board_info_area_size = IpmiFruFinalizeArea(board_area_ptr, varp-board_area_ptr);
}